

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::initCacheSaveDevice(QNetworkReplyImplPrivate *this)

{
  bool bVar1;
  int iVar2;
  QNetworkReplyImpl *url;
  QAbstractNetworkCache *pQVar3;
  QIODevice *pQVar4;
  ulong uVar5;
  undefined8 uVar6;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  iterator iVar7;
  QNetworkReplyImpl *q;
  AttributesMap attributes;
  QNetworkCacheMetaData metaData;
  QVariant redirectionTarget;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar8;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this_00;
  undefined1 in_stack_ffffffffffffff60 [16];
  QNetworkReplyImplPrivate *this_01;
  char local_80 [36];
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  url = q_func(in_RDI);
  QNetworkReply::attribute
            ((QNetworkReply *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff60._12_4_);
  iVar2 = QVariant::toInt((bool *)&local_28);
  QVariant::~QVariant(&local_28);
  if (iVar2 == 0xce) {
    in_RDI->cacheEnabled = false;
  }
  else {
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QNetworkCacheMetaData::QNetworkCacheMetaData((QNetworkCacheMetaData *)in_RDI);
    QNetworkCacheMetaData::setUrl((QNetworkCacheMetaData *)this_01,(QUrl *)url);
    this_00 = in_stack_ffffffffffffff60._0_8_;
    local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_48._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QNetworkReply::attribute
              ((QNetworkReply *)CONCAT44(iVar2,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff60._12_4_);
    bVar1 = QVariant::isValid((QVariant *)in_RDI);
    if (bVar1) {
      local_58 = 0xaaaaaaaaaaaaaaaa;
      QNetworkCacheMetaData::attributes
                ((QNetworkCacheMetaData *)CONCAT44(iVar2,in_stack_ffffffffffffff58));
      local_5c = 2;
      iVar7 = QHash<QNetworkRequest::Attribute,_QVariant>::insert
                        ((QHash<QNetworkRequest::Attribute,_QVariant> *)in_RDI,
                         (Attribute *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                         (QVariant *)0x1eb8f4);
      this_00 = iVar7.i.d;
      QNetworkCacheMetaData::setAttributes
                ((QNetworkCacheMetaData *)in_RDI,
                 (AttributesMap *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
                ((QHash<QNetworkRequest::Attribute,_QVariant> *)in_RDI);
    }
    pQVar3 = networkCache((QNetworkReplyImplPrivate *)
                          CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    pQVar4 = (QIODevice *)(**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&local_50);
    in_RDI->cacheSaveDevice = pQVar4;
    if ((in_RDI->cacheSaveDevice == (QIODevice *)0x0) ||
       (uVar5 = QIODevice::isOpen(), (uVar5 & 1) == 0)) {
      bVar8 = 0;
      if (in_RDI->cacheSaveDevice != (QIODevice *)0x0) {
        bVar8 = QIODevice::isOpen();
        bVar8 = bVar8 ^ 0xff;
      }
      if ((bVar8 & 1) != 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff58),
                   (int)((ulong)in_RDI >> 0x20),(char *)CONCAT17(bVar8,in_stack_ffffffffffffff48));
        pQVar3 = networkCache((QNetworkReplyImplPrivate *)CONCAT17(bVar8,in_stack_ffffffffffffff48))
        ;
        (*(code *)**(undefined8 **)pQVar3)();
        uVar6 = QMetaObject::className();
        QMessageLogger::critical
                  (local_80,
                   "QNetworkReplyImpl: network cache returned a device that is not open -- class %s probably needs to be fixed"
                   ,uVar6);
      }
      pQVar3 = networkCache((QNetworkReplyImplPrivate *)CONCAT17(bVar8,in_stack_ffffffffffffff48));
      (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&(in_RDI->super_QNetworkReplyPrivate).url);
      in_RDI->cacheSaveDevice = (QIODevice *)0x0;
      in_RDI->cacheEnabled = false;
    }
    QVariant::~QVariant((QVariant *)&local_48);
    QNetworkCacheMetaData::~QNetworkCacheMetaData((QNetworkCacheMetaData *)0x1eba2b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::initCacheSaveDevice()
{
    Q_Q(QNetworkReplyImpl);

    // The disk cache does not support partial content, so don't even try to
    // save any such content into the cache.
    if (q->attribute(QNetworkRequest::HttpStatusCodeAttribute).toInt() == 206) {
        cacheEnabled = false;
        return;
    }

    // save the meta data
    QNetworkCacheMetaData metaData;
    metaData.setUrl(url);
    // @todo @future: fetchCacheMetaData is not currently implemented in any backend, but can be useful again in the future
    // metaData = backend->fetchCacheMetaData(metaData);

    // save the redirect request also in the cache
    QVariant redirectionTarget = q->attribute(QNetworkRequest::RedirectionTargetAttribute);
    if (redirectionTarget.isValid()) {
        QNetworkCacheMetaData::AttributesMap attributes = metaData.attributes();
        attributes.insert(QNetworkRequest::RedirectionTargetAttribute, redirectionTarget);
        metaData.setAttributes(attributes);
    }

    cacheSaveDevice = networkCache()->prepare(metaData);

    if (!cacheSaveDevice || !cacheSaveDevice->isOpen()) {
        if (Q_UNLIKELY(cacheSaveDevice && !cacheSaveDevice->isOpen()))
            qCritical("QNetworkReplyImpl: network cache returned a device that is not open -- "
                  "class %s probably needs to be fixed",
                  networkCache()->metaObject()->className());

        networkCache()->remove(url);
        cacheSaveDevice = nullptr;
        cacheEnabled = false;
    }
}